

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

void vkt::pipeline::multisample::uploadVertexDataNdc
               (Allocation *vertexBufferAllocation,VertexDataDesc *vertexDataDescripton)

{
  void *dst;
  VertexDataNdc *src;
  Vector<float,_4> local_bc;
  VertexDataNdc local_ac;
  Vector<float,_4> local_9c;
  VertexDataNdc local_8c;
  Vector<float,_4> local_7c;
  VertexDataNdc local_6c;
  Vector<float,_4> local_50;
  VertexDataNdc local_40;
  undefined1 local_30 [8];
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  vertices;
  VertexDataDesc *vertexDataDescripton_local;
  Allocation *vertexBufferAllocation_local;
  
  vertices.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)vertexDataDescripton;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::vector((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
            *)local_30);
  tcu::Vector<float,_4>::Vector(&local_50,-1.0,-1.0,0.0,1.0);
  VertexDataNdc::VertexDataNdc(&local_40,&local_50);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
               *)local_30,&local_40);
  tcu::Vector<float,_4>::Vector(&local_7c,1.0,-1.0,0.0,1.0);
  VertexDataNdc::VertexDataNdc(&local_6c,&local_7c);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
               *)local_30,&local_6c);
  tcu::Vector<float,_4>::Vector(&local_9c,-1.0,1.0,0.0,1.0);
  VertexDataNdc::VertexDataNdc(&local_8c,&local_9c);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
               *)local_30,&local_8c);
  tcu::Vector<float,_4>::Vector(&local_bc,1.0,1.0,0.0,1.0);
  VertexDataNdc::VertexDataNdc(&local_ac,&local_bc);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
               *)local_30,&local_ac);
  dst = ::vk::Allocation::getHostPtr(vertexBufferAllocation);
  src = dataPointer<vkt::pipeline::multisample::VertexDataNdc>
                  ((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
                    *)local_30);
  ::deMemcpy(dst,src,*(size_t *)
                      vertices.
                      super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[1].positionNdc.m_data);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::~vector((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
             *)local_30);
  return;
}

Assistant:

void uploadVertexDataNdc (const Allocation& vertexBufferAllocation, const MultisampleInstanceBase::VertexDataDesc& vertexDataDescripton)
{
	std::vector<VertexDataNdc> vertices;

	vertices.push_back(VertexDataNdc(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f)));
	vertices.push_back(VertexDataNdc(tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f)));
	vertices.push_back(VertexDataNdc(tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f)));
	vertices.push_back(VertexDataNdc(tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f)));

	deMemcpy(vertexBufferAllocation.getHostPtr(), dataPointer(vertices), static_cast<std::size_t>(vertexDataDescripton.dataSize));
}